

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::SetIsClosed(ScriptContext *this)

{
  int iVar1;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  SimpleDictionaryEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_> *pSVar3;
  Type this_00;
  int iVar4;
  ulong uVar5;
  AutoNestedHandledExceptionType local_2c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if ((this->super_ScriptContextBase).isClosed == false) {
    (this->super_ScriptContextBase).isClosed = true;
    if ((this->super_ScriptContextBase).javascriptLibrary != (JavascriptLibrary *)0x0) {
      DynamicProfileInfo::DumpScriptContext(this);
      DynamicProfileInfo::DumpScriptContextToFile(this);
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_2c,ExceptionType_OutOfMemory);
      DynamicProfileInfo::Save(this);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_2c);
      pBVar2 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).sourceContextInfoMap.ptr
      ;
      if (pBVar2 != (BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)0x0) {
        for (uVar5 = 0; uVar5 < pBVar2->bucketCount; uVar5 = uVar5 + 1) {
          iVar4 = (pBVar2->buckets).ptr[uVar5];
          if (iVar4 != -1) {
            while (iVar4 != -1) {
              pSVar3 = (pBVar2->entries).ptr;
              iVar1 = pSVar3[iVar4].
                      super_DefaultHashedEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                      .
                      super_KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                      .
                      super_ValueEntry<Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>_>
                      .
                      super_KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                      .next;
              this_00.ptr = ((pSVar3[iVar4].
                              super_DefaultHashedEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                              .
                              super_KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                              .
                              super_ValueEntry<Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>_>
                              .
                              super_KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                              .value.ptr)->sourceDynamicProfileManager).ptr;
              iVar4 = iVar1;
              if (this_00.ptr != (SourceDynamicProfileManager *)0x0) {
                SourceDynamicProfileManager::ClearSavingData(this_00.ptr);
              }
            }
          }
        }
      }
      ClearDynamicProfileList(this);
    }
    PrintStats(this);
  }
  return;
}

Assistant:

void ScriptContext::SetIsClosed()
    {
        if (!this->isClosed)
        {
            this->isClosed = true;

            if (this->javascriptLibrary)
            {
                JS_ETW(EtwTrace::LogSourceUnloadEvents(this));

#if ENABLE_PROFILE_INFO
#if DBG_DUMP
                DynamicProfileInfo::DumpScriptContext(this);
#endif
#ifdef RUNTIME_DATA_COLLECTION
                DynamicProfileInfo::DumpScriptContextToFile(this);
#endif
#endif

#if ENABLE_PROFILE_INFO
#ifdef DYNAMIC_PROFILE_STORAGE
                HRESULT hr = S_OK;
                BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
                {
                    DynamicProfileInfo::Save(this);
                }
                END_TRANSLATE_OOM_TO_HRESULT(hr);

                if (this->Cache()->sourceContextInfoMap)
                {
                    this->Cache()->sourceContextInfoMap->Map([&](DWORD_PTR dwHostSourceContext, SourceContextInfo * sourceContextInfo)
                    {
                        if (sourceContextInfo->sourceDynamicProfileManager)
                        {
                            sourceContextInfo->sourceDynamicProfileManager->ClearSavingData();
                        }
                    });
                }
#endif

#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
                this->ClearDynamicProfileList();
#endif
#endif
            }

            this->PrintStats();
        }
    }